

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O2

void WriteTableIntoFile(FILE *pFile)

{
  varvalue vVar1;
  Cube *pC;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  pC = IterCubeSetStart();
  do {
    if (pC == (Cube *)0x0) {
      return;
    }
    if (pC->fMark != '\0') {
      __assert_fail("p->fMark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                    ,0x92,"void WriteTableIntoFile(FILE *)");
    }
    for (iVar2 = 0; iVar2 < g_CoverInfo.nVarsIn; iVar2 = iVar2 + 1) {
      vVar1 = GetVar(pC,iVar2);
      if (2 < vVar1 - VAR_NEG) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                      ,0x9f,"void WriteTableIntoFile(FILE *)");
      }
      fputc(*(int *)(&DAT_007953b8 + (ulong)(vVar1 - VAR_NEG) * 4),(FILE *)pFile);
    }
    fputc(0x20,(FILE *)pFile);
    iVar2 = g_CoverInfo.nVarsOut;
    iVar3 = 0;
    for (lVar6 = 0; lVar6 < g_CoverInfo.nWordsOut; lVar6 = lVar6 + 1) {
      uVar5 = 0;
      do {
        iVar4 = iVar3;
        if (uVar5 == 0x20) break;
        fputc(((pC->pCubeDataOut[lVar6] >> (uVar5 & 0x1f) & 1) != 0) + 0x30,(FILE *)pFile);
        iVar3 = iVar3 + 1;
        uVar5 = uVar5 + 1;
        iVar4 = iVar2;
      } while (iVar2 != iVar3);
      iVar3 = iVar4;
    }
    fputc(10,(FILE *)pFile);
    pC = IterCubeSetNext();
  } while( true );
}

Assistant:

void WriteTableIntoFile( FILE * pFile )
// nCubesAlloc is the number of allocated cubes 
{
    int v, w;
    Cube * p;
    int cOutputs;
    int nOutput;
    int WordSize;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            int Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                fprintf( pFile, "0" );
            else if ( Value == VAR_POS )
                fprintf( pFile, "1" );
            else if ( Value == VAR_ABS )
                fprintf( pFile, "-" );
            else
                assert(0);
        }
        fprintf( pFile, " " );

        // write the output variables
        cOutputs = 0;
        nOutput = g_CoverInfo.nVarsOut;
        WordSize = 8*sizeof( unsigned );
        for ( w = 0; w < g_CoverInfo.nWordsOut; w++ )
            for ( v = 0; v < WordSize; v++ )
            {
                if ( p->pCubeDataOut[w] & (1<<v) )
                    fprintf( pFile, "1" );
                else
                    fprintf( pFile, "0" );
                if ( ++cOutputs == nOutput )
                    break;
            }
        fprintf( pFile, "\n" );
    }
}